

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# revp.c
# Opt level: O2

void REVunfreeze_stone_handler
               (CManager_conflict cm,CMConnection conn,void *data,void *client_data,
               attr_list message_attrs)

{
  int iVar1;
  CMFormat format;
  EV_int_response response;
  undefined4 local_28;
  int local_24;
  
  format = CMlookup_format(conn->cm,EV_int_response_formats);
  if (format == (CMFormat)0x0) {
    format = INT_CMregister_format(conn->cm,EV_int_response_formats);
  }
  iVar1 = EVunfreeze_stone(cm,*(EVstone *)((long)data + 4));
  _local_28 = CONCAT44(iVar1,*data);
  CMwrite(conn,format,&local_28);
  return;
}

Assistant:

static void
REVunfreeze_stone_handler(CManager cm, CMConnection conn, void *data,void *client_data,attr_list message_attrs)
{
    EV_int_response response;
    EVunfreeze_stone_request *request = (EVunfreeze_stone_request *) data;
    int ret;
    CMFormat f = CMlookup_format(conn->cm, EV_int_response_formats);
    (void) message_attrs;
    (void) client_data;
    if (f == NULL) {
        f = INT_CMregister_format(conn->cm, EV_int_response_formats);
    }
    ret = EVunfreeze_stone(cm, request->stone_id);
    response.ret = ret;;
    response.condition_var = request->condition_var;
    CMwrite(conn, f, &response);
}